

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Store::Store(Store *this,Features *features)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Ref ref;
  Object *local_18;
  
  bVar1 = features->reference_types_enabled_;
  bVar2 = features->annotations_enabled_;
  bVar3 = features->gc_enabled_;
  (this->features_).bulk_memory_enabled_ = features->bulk_memory_enabled_;
  (this->features_).reference_types_enabled_ = bVar1;
  (this->features_).annotations_enabled_ = bVar2;
  (this->features_).gc_enabled_ = bVar3;
  bVar1 = features->mutable_globals_enabled_;
  bVar2 = features->sat_float_to_int_enabled_;
  bVar3 = features->sign_extension_enabled_;
  bVar4 = features->simd_enabled_;
  bVar5 = features->threads_enabled_;
  bVar6 = features->multi_value_enabled_;
  bVar7 = features->tail_call_enabled_;
  (this->features_).exceptions_enabled_ = features->exceptions_enabled_;
  (this->features_).mutable_globals_enabled_ = bVar1;
  (this->features_).sat_float_to_int_enabled_ = bVar2;
  (this->features_).sign_extension_enabled_ = bVar3;
  (this->features_).simd_enabled_ = bVar4;
  (this->features_).threads_enabled_ = bVar5;
  (this->features_).multi_value_enabled_ = bVar6;
  (this->features_).tail_call_enabled_ = bVar7;
  (this->objects_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->objects_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->objects_).list_.
  super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects_).list_.
  super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects_).list_.
  super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->objects_).free_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects_).free_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects_).free_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->objects_).free_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->objects_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base + 4) = 0;
  (this->roots_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->roots_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->objects_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->roots_).list_.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->roots_).list_.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->roots_).list_.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->roots_).free_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->roots_).free_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->roots_).free_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->roots_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->roots_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = 0;
  (this->roots_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_18 = (Object *)operator_new(0x40);
  local_18->_vptr_Object = (_func_int **)&PTR__Object_001f0620;
  local_18->kind_ = Null;
  *(undefined8 *)&(local_18->finalizer_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(local_18->finalizer_).super__Function_base._M_functor + 8) = 0;
  (local_18->finalizer_).super__Function_base._M_manager = (_Manager_type)0x0;
  (local_18->finalizer_)._M_invoker = (_Invoker_type)0x0;
  local_18->host_info_ = (void *)0x0;
  (local_18->self_).index = 0;
  ref.index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
              ::New<wabt::interp::Object*>
                        ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                          *)&this->objects_,&local_18);
  if (ref.index == 0) {
    FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&this->roots_,&ref);
    return;
  }
  __assert_fail("ref == Ref::Null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp.cc"
                ,0xc6,"wabt::interp::Store::Store(const Features &)");
}

Assistant:

Store::Store(const Features& features) : features_(features) {
  Ref ref{objects_.New(new Object(ObjectKind::Null))};
  assert(ref == Ref::Null);
  roots_.New(ref);
}